

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::ValueFlag<double,_args::ValueReader<double>_>::ParseValue
          (ValueFlag<double,_args::ValueReader<double>_> *this,string *value_)

{
  ValueReader<double>::operator()
            ((ValueReader<double> *)&this->field_0xd0,
             &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,value_,&this->value);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }